

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> __thiscall
anon_unknown.dwarf_35d0fd::BuildSystemEngineDelegate::lookupRule
          (BuildSystemEngineDelegate *this,KeyType *keyData)

{
  pointer pcVar1;
  NodeType NVar2;
  uint uVar3;
  long lVar4;
  void *pvVar5;
  StatNode *__ptr_00;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  CommandSignature CVar10;
  Kind KVar11;
  int iVar12;
  char *pcVar13;
  BuildNode *this_00;
  ulong uVar14;
  long *plVar15;
  BuildSystemRule *pBVar16;
  iterator iVar17;
  default_delete<llbuild::buildsystem::StatNode> *this_01;
  code *pcVar18;
  KeyType *in_RDX;
  pointer *__ptr;
  long *plVar19;
  long lVar20;
  CommandSignature CVar21;
  _Any_data *p_Var22;
  size_type *this_02;
  StringRef SVar23;
  string path_1;
  string path;
  string filters;
  BuildKey key;
  undefined1 local_6e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6c8;
  undefined1 local_6b8;
  undefined7 uStack_6b7;
  ulong uStack_6b0;
  CommandSignature local_6a8;
  long local_6a0;
  undefined1 local_698 [16];
  undefined1 local_688 [16];
  long local_678;
  undefined1 local_670;
  undefined7 uStack_66f;
  long lStack_668;
  BuildKey local_660;
  _Head_base<0UL,_llbuild::core::Rule_*,_false> local_640;
  _Any_data local_638;
  code *local_628;
  code *pcStack_620;
  _Any_data local_618;
  code *local_608;
  code *pcStack_600;
  _Any_data local_5f8;
  code *local_5e8;
  code *pcStack_5e0;
  _Any_data local_5d8;
  code *local_5c8;
  code *pcStack_5c0;
  _Any_data local_5b8;
  code *local_5a8;
  code *pcStack_5a0;
  _Any_data local_598;
  code *local_588;
  code *pcStack_580;
  _Any_data local_578;
  code *local_568;
  code *pcStack_560;
  _Any_data local_558;
  code *local_548;
  code *pcStack_540;
  _Any_data local_538;
  code *local_528;
  code *pcStack_520;
  _Any_data local_518;
  code *local_508;
  code *pcStack_500;
  _Any_data local_4f8;
  code *local_4e8;
  code *pcStack_4e0;
  _Any_data local_4d8;
  code *local_4c8;
  code *pcStack_4c0;
  _Any_data local_4b8;
  code *local_4a8;
  code *pcStack_4a0;
  _Any_data local_498;
  code *local_488;
  code *pcStack_480;
  _Any_data local_478;
  code *local_468;
  code *pcStack_460;
  _Any_data local_458;
  code *local_448;
  undefined8 uStack_440;
  _Any_data local_438;
  code *local_428;
  code *pcStack_420;
  _Any_data local_418;
  code *local_408;
  undefined8 uStack_400;
  _Any_data local_3f8;
  code *local_3e8;
  code *pcStack_3e0;
  _Any_data local_3d8;
  code *local_3c8;
  code *pcStack_3c0;
  _Any_data local_3b8;
  code *local_3a8;
  code *local_3a0;
  _Any_data local_398;
  code *local_388;
  undefined8 uStack_380;
  _Any_data local_378;
  code *local_368;
  undefined8 uStack_360;
  _Any_data local_358;
  code *local_348;
  undefined8 uStack_340;
  _Any_data local_338;
  code *local_328;
  code *local_320;
  _Any_data local_318;
  code *local_308;
  code *local_300;
  _Any_data local_2f8;
  code *local_2e8;
  code *pcStack_2e0;
  _Any_data local_2d8;
  code *local_2c8;
  code *pcStack_2c0;
  _Any_data local_2b8;
  code *local_2a8;
  code *pcStack_2a0;
  _Any_data local_298;
  code *local_288;
  code *pcStack_280;
  _Any_data local_278;
  code *local_268;
  code *local_260;
  _Any_data local_258;
  code *local_248;
  code *local_240;
  _Any_data local_238;
  code *local_228;
  undefined8 uStack_220;
  _Any_data local_218;
  code *local_208;
  undefined8 uStack_200;
  _Any_data local_1f8;
  code *local_1e8;
  undefined8 uStack_1e0;
  _Any_data local_1d8;
  code *local_1c8;
  undefined8 uStack_1c0;
  _Any_data local_1b8;
  code *local_1a8;
  undefined8 uStack_1a0;
  _Any_data local_198;
  code *local_188;
  undefined8 uStack_180;
  _Any_data local_178;
  code *local_168;
  undefined8 uStack_160;
  _Any_data local_158;
  code *local_148;
  undefined8 uStack_140;
  _Any_data local_138;
  code *local_128;
  undefined8 uStack_120;
  _Any_data local_118;
  code *local_108;
  undefined8 uStack_100;
  _Any_data local_f8;
  code *local_e8;
  undefined8 uStack_e0;
  _Any_data local_d8;
  code *local_c8;
  undefined8 uStack_c0;
  _Any_data local_b8;
  code *local_a8;
  undefined8 uStack_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  
  llbuild::buildsystem::BuildKey::fromData(&local_660,in_RDX);
  KVar11 = llbuild::buildsystem::BuildKey::kindForIdentifier(*local_660.key.key._M_dataplus._M_p);
  switch(KVar11) {
  case Command:
    lVar20 = *(long *)((keyData->key)._M_string_length + 0x68);
    if (lVar20 == 0) {
LAB_0019f57e:
      __assert_fail("buildDescription",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                    ,0x10b,
                    "const BuildDescription &(anonymous namespace)::BuildSystemImpl::getBuildDescription() const"
                   );
    }
    SVar23 = llbuild::buildsystem::BuildKey::getCommandName(&local_660);
    iVar12 = llvm::StringMapImpl::FindKey((StringMapImpl *)(lVar20 + 0x40),SVar23);
    uVar14 = (long)iVar12;
    if (iVar12 == -1) {
      uVar14 = (ulong)*(uint *)(lVar20 + 0x48);
    }
    lVar4 = *(long *)((keyData->key)._M_string_length + 0x68);
    if (lVar4 == 0) goto LAB_0019f57e;
    plVar15 = (long *)(uVar14 * 8 + *(long *)(lVar20 + 0x40));
    if (plVar15 == (long *)((ulong)*(uint *)(lVar4 + 0x48) * 8 + *(long *)(lVar4 + 0x40))) {
      pBVar16 = (BuildSystemRule *)operator_new(0x90);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_6e8._8_8_;
      local_6e8._0_16_ = auVar9 << 0x40;
      local_258._M_unused._M_object = (void *)0x0;
      local_258._8_8_ = 0;
      local_240 = std::
                  _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1739:21)>
                  ::_M_invoke;
      local_248 = std::
                  _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1739:21)>
                  ::_M_manager;
      local_278._M_unused._M_object = (void *)0x0;
      local_278._8_8_ = 0;
      local_260 = std::
                  _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1742:22)>
                  ::_M_invoke;
      local_268 = std::
                  _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1742:22)>
                  ::_M_manager;
      local_58._M_unused._M_object = (void *)0x0;
      local_58._8_8_ = 0;
      local_48 = (code *)0x0;
      uStack_40 = 0;
      BuildSystemRule::BuildSystemRule
                (pBVar16,in_RDX,(CommandSignature *)local_6e8,
                 (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_258,
                 (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                  *)&local_278,
                 (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
                 &local_58);
      (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar16;
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,__destroy_functor);
      }
      if (local_268 != (code *)0x0) {
        (*local_268)(&local_278,&local_278,__destroy_functor);
      }
      if (local_248 == (code *)0x0) goto LAB_0019f2d7;
      p_Var22 = &local_258;
      pcVar18 = local_248;
    }
    else {
      plVar15 = *(long **)(*plVar15 + 8);
      pBVar16 = (BuildSystemRule *)operator_new(0x90);
      local_6e8._0_8_ = (**(code **)(*plVar15 + 0x30))(plVar15);
      local_298._8_8_ = 0;
      pcStack_280 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1754:19)>
                    ::_M_invoke;
      local_288 = std::
                  _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1754:19)>
                  ::_M_manager;
      local_2b8._8_8_ = 0;
      pcStack_2a0 = std::
                    _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1757:20)>
                    ::_M_invoke;
      local_2a8 = std::
                  _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1757:20)>
                  ::_M_manager;
      local_78._8_8_ = 0;
      pcStack_60 = std::
                   _Function_handler<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1762:25)>
                   ::_M_invoke;
      local_68 = std::
                 _Function_handler<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1762:25)>
                 ::_M_manager;
      local_2b8._M_unused._M_object = plVar15;
      local_298._M_unused._M_object = plVar15;
      local_78._M_unused._M_object = plVar15;
      BuildSystemRule::BuildSystemRule
                (pBVar16,in_RDX,(CommandSignature *)local_6e8,
                 (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_298,
                 (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                  *)&local_2b8,
                 (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
                 &local_78);
      (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar16;
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,__destroy_functor);
      }
      if (local_2a8 != (code *)0x0) {
        (*local_2a8)(&local_2b8,&local_2b8,__destroy_functor);
      }
      if (local_288 == (code *)0x0) goto LAB_0019f2d7;
      p_Var22 = &local_298;
      pcVar18 = local_288;
    }
    break;
  case CustomTask:
    lVar20 = *(long *)((keyData->key)._M_string_length + 0x68);
    if (lVar20 == 0) goto LAB_0019f57e;
    plVar15 = *(long **)(lVar20 + 0x60);
    uVar3 = *(uint *)(lVar20 + 0x68);
    plVar19 = plVar15;
    if ((ulong)uVar3 != 0) {
      for (; (*plVar19 == 0 || (*plVar19 == -8)); plVar19 = plVar19 + 1) {
      }
    }
    local_640._M_head_impl = (Rule *)this;
    if (plVar19 != plVar15 + uVar3) {
      do {
        (**(code **)(**(long **)(*plVar19 + 8) + 0x30))
                  (local_6e8,*(long **)(*plVar19 + 8),&local_660);
        if ((pointer)local_6e8._0_8_ != (pointer)0x0) {
          std::
          vector<std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>,std::allocator<std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>>>
          ::
          emplace_back<std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>>
                    ((vector<std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>,std::allocator<std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>>>
                      *)(keyData + 4),
                     (unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
                      *)local_6e8);
          plVar15 = *(long **)(keyData[4].key._M_string_length - 8);
          pBVar16 = (BuildSystemRule *)operator_new(0x90);
          local_6a8.value = (**(code **)(*plVar15 + 0x30))(plVar15);
          local_2d8._8_8_ = 0;
          pcStack_2c0 = std::
                        _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1787:21)>
                        ::_M_invoke;
          local_2c8 = std::
                      _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1787:21)>
                      ::_M_manager;
          local_2f8._8_8_ = 0;
          pcStack_2e0 = std::
                        _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1790:22)>
                        ::_M_invoke;
          local_2e8 = std::
                      _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1790:22)>
                      ::_M_manager;
          local_98._8_8_ = 0;
          pcStack_80 = std::
                       _Function_handler<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1795:27)>
                       ::_M_invoke;
          local_88 = std::
                     _Function_handler<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1795:27)>
                     ::_M_manager;
          local_2f8._M_unused._M_object = plVar15;
          local_2d8._M_unused._M_object = plVar15;
          local_98._M_unused._M_object = plVar15;
          BuildSystemRule::BuildSystemRule
                    (pBVar16,in_RDX,&local_6a8,
                     (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_2d8,
                     (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                      *)&local_2f8,
                     (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>
                      *)&local_98);
          this = (BuildSystemEngineDelegate *)local_640;
          *(BuildSystemRule **)local_640._M_head_impl = pBVar16;
          if (local_88 != (code *)0x0) {
            (*local_88)(&local_98,&local_98,__destroy_functor);
          }
          if (local_2e8 != (code *)0x0) {
            (*local_2e8)(&local_2f8,&local_2f8,__destroy_functor);
          }
          if (local_2c8 != (code *)0x0) {
            (*local_2c8)(&local_2d8,&local_2d8,__destroy_functor);
          }
          if ((long *)local_6e8._0_8_ != (long *)0x0) {
            (**(code **)(*(long *)local_6e8._0_8_ + 8))();
          }
          goto LAB_0019f2d7;
        }
        do {
          do {
            plVar19 = plVar19 + 1;
          } while (*plVar19 == 0);
        } while (*plVar19 == -8);
      } while (plVar19 != plVar15 + uVar3);
    }
    pBVar16 = (BuildSystemRule *)operator_new(0x90);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_6e8._8_8_;
    local_6e8._0_16_ = auVar8 << 0x40;
    local_318._M_unused._M_object = (void *)0x0;
    local_318._8_8_ = 0;
    local_300 = std::
                _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1808:19)>
                ::_M_invoke;
    local_308 = std::
                _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1808:19)>
                ::_M_manager;
    local_338._M_unused._M_object = (void *)0x0;
    local_338._8_8_ = 0;
    local_320 = std::
                _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1811:20)>
                ::_M_invoke;
    local_328 = std::
                _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1811:20)>
                ::_M_manager;
    local_b8._M_unused._M_object = (void *)0x0;
    local_b8._8_8_ = 0;
    local_a8 = (code *)0x0;
    uStack_a0 = 0;
    BuildSystemRule::BuildSystemRule
              (pBVar16,in_RDX,(CommandSignature *)local_6e8,
               (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_318,
               (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                *)&local_338,
               (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               &local_b8);
    this = (BuildSystemEngineDelegate *)local_640._M_head_impl;
    (local_640._M_head_impl)->_vptr_Rule = (_func_int **)pBVar16;
    if (local_a8 != (code *)0x0) {
      (*local_a8)(&local_b8,&local_b8,__destroy_functor);
    }
    if (local_328 != (code *)0x0) {
      (*local_328)(&local_338,&local_338,__destroy_functor);
    }
    if (local_308 == (code *)0x0) goto LAB_0019f2d7;
    p_Var22 = &local_318;
    pcVar18 = local_308;
    break;
  case DirectoryContents:
    SVar23 = llbuild::buildsystem::BuildKey::getDirectoryPath(&local_660);
    pcVar13 = SVar23.Data;
    if (pcVar13 == (char *)0x0) {
      local_6e8._8_8_ = 0;
      local_6e8._0_8_ = local_6e8 + 0x10;
      local_6e8[0x10] = '\0';
    }
    else {
      local_6e8._0_8_ = local_6e8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6e8,pcVar13,pcVar13 + SVar23.Length);
    }
    pBVar16 = (BuildSystemRule *)operator_new(0x90);
    local_688._0_8_ = 0;
    local_6a8.value = (uint64_t)local_698;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6a8,local_6e8._0_8_,(pointer)(local_6e8._0_8_ + local_6e8._8_8_));
    local_628 = (code *)0x0;
    pcStack_620 = (code *)0x0;
    local_638._M_unused._M_object = (void *)0x0;
    local_638._8_8_ = 0;
    local_638._M_unused._M_object = operator_new(0x20);
    *(code **)local_638._M_unused._0_8_ = (code *)((long)local_638._M_unused._0_8_ + 0x10);
    if ((StatNode *)local_6a8.value == (StatNode *)local_698) {
      *(undefined4 *)((long)local_638._M_unused._0_8_ + 0x10) = local_698._0_4_;
      *(undefined4 *)((long)local_638._M_unused._0_8_ + 0x14) = local_698._4_4_;
      *(undefined4 *)((long)local_638._M_unused._0_8_ + 0x18) = local_698._8_4_;
      *(undefined4 *)((long)local_638._M_unused._0_8_ + 0x1c) = local_698._12_4_;
    }
    else {
      *(uint64_t *)local_638._M_unused._0_8_ = local_6a8.value;
      *(long *)((long)local_638._M_unused._0_8_ + 0x10) = CONCAT44(local_698._4_4_,local_698._0_4_);
    }
    *(long *)((long)local_638._M_unused._0_8_ + 8) = local_6a0;
    local_6a0 = 0;
    local_698._0_4_ = local_698._0_4_ & 0xffffff00;
    pcStack_620 = std::
                  _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1823:19)>
                  ::_M_invoke;
    local_628 = std::
                _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1823:19)>
                ::_M_manager;
    local_6a8.value = (uint64_t)local_698;
    local_688._8_8_ = &local_670;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_688 + 8),local_6e8._0_8_,
               (pointer)(local_6e8._0_8_ + local_6e8._8_8_));
    local_5a8 = (code *)0x0;
    pcStack_5a0 = (code *)0x0;
    local_5b8._M_unused._M_object = (void *)0x0;
    local_5b8._8_8_ = 0;
    local_5b8._M_unused._M_object = operator_new(0x20);
    *(code **)local_5b8._M_unused._0_8_ = (code *)((long)local_5b8._M_unused._0_8_ + 0x10);
    if ((undefined1 *)local_688._8_8_ == &local_670) {
      *(long *)((long)local_5b8._M_unused._0_8_ + 0x10) = CONCAT71(uStack_66f,local_670);
      *(long *)((long)local_5b8._M_unused._0_8_ + 0x18) = lStack_668;
    }
    else {
      *(undefined8 *)local_5b8._M_unused._0_8_ = local_688._8_8_;
      *(long *)((long)local_5b8._M_unused._0_8_ + 0x10) = CONCAT71(uStack_66f,local_670);
    }
    *(long *)((long)local_5b8._M_unused._0_8_ + 8) = local_678;
    local_678 = 0;
    local_670 = 0;
    pcStack_5a0 = std::
                  _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1826:20)>
                  ::_M_invoke;
    local_5a8 = std::
                _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1826:20)>
                ::_M_manager;
    local_d8._M_unused._M_object = (void *)0x0;
    local_d8._8_8_ = 0;
    local_c8 = (code *)0x0;
    uStack_c0 = 0;
    local_688._8_8_ = &local_670;
    BuildSystemRule::BuildSystemRule
              (pBVar16,in_RDX,(CommandSignature *)local_688,
               (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_638,
               (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                *)&local_5b8,
               (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               &local_d8);
    (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar16;
    if (local_c8 != (code *)0x0) {
      (*local_c8)(&local_d8,&local_d8,__destroy_functor);
    }
    if (local_5a8 != (code *)0x0) {
      (*local_5a8)(&local_5b8,&local_5b8,__destroy_functor);
    }
    if ((undefined1 *)local_688._8_8_ != &local_670) {
      operator_delete((void *)local_688._8_8_,CONCAT71(uStack_66f,local_670) + 1);
    }
    if (local_628 != (code *)0x0) {
      (*local_628)(&local_638,&local_638,__destroy_functor);
    }
    if ((StatNode *)local_6a8.value != (StatNode *)local_698) {
      operator_delete((void *)local_6a8.value,CONCAT44(local_698._4_4_,local_698._0_4_) + 1);
    }
    if ((StatNode *)local_6e8._0_8_ == (StatNode *)(local_6e8 + 0x10)) goto LAB_0019f2d7;
    lVar20 = CONCAT71(local_6e8._17_7_,local_6e8[0x10]);
    CVar21.value = local_6e8._0_8_;
    goto LAB_0019ed70;
  case FilteredDirectoryContents:
    SVar23 = llbuild::buildsystem::BuildKey::getFilteredDirectoryPath(&local_660);
    pcVar13 = SVar23.Data;
    if (pcVar13 == (char *)0x0) {
      local_6a8.value = (uint64_t)local_698;
      local_6a0 = 0;
      local_698._0_4_ = local_698._0_4_ & 0xffffff00;
    }
    else {
      local_6a8.value = (uint64_t)local_698;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6a8,pcVar13,pcVar13 + SVar23.Length);
    }
    SVar23 = llbuild::buildsystem::BuildKey::getContentExclusionPatterns(&local_660);
    pcVar13 = SVar23.Data;
    if (pcVar13 == (char *)0x0) {
      local_688._8_8_ = &local_670;
      local_678 = 0;
      local_670 = 0;
    }
    else {
      local_688._8_8_ = &local_670;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_688 + 8),pcVar13,pcVar13 + SVar23.Length);
    }
    pBVar16 = (BuildSystemRule *)operator_new(0x90);
    local_688._0_8_ = 0;
    pcVar1 = local_6e8 + 0x10;
    local_6e8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_6e8,local_6a8.value,(undefined1 *)(local_6a0 + local_6a8.value));
    local_6c8._M_allocated_capacity = (size_type)&local_6b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6c8,local_688._8_8_,(undefined1 *)(local_678 + local_688._8_8_));
    local_5c8 = (code *)0x0;
    pcStack_5c0 = (code *)0x0;
    local_5d8._M_unused._M_object = (void *)0x0;
    local_5d8._8_8_ = 0;
    local_5d8._M_unused._M_object = operator_new(0x40);
    *(code **)local_5d8._M_unused._0_8_ = (code *)((long)local_5d8._M_unused._0_8_ + 0x10);
    if ((pointer)local_6e8._0_8_ == pcVar1) {
      *(ulong *)((long)local_5d8._M_unused._0_8_ + 0x10) =
           CONCAT71(local_6e8._17_7_,local_6e8[0x10]);
      *(undefined8 *)((long)local_5d8._M_unused._0_8_ + 0x18) = local_6e8._24_8_;
    }
    else {
      *(undefined8 *)local_5d8._M_unused._0_8_ = local_6e8._0_8_;
      *(ulong *)((long)local_5d8._M_unused._0_8_ + 0x10) =
           CONCAT71(local_6e8._17_7_,local_6e8[0x10]);
    }
    *(undefined8 *)((long)local_5d8._M_unused._0_8_ + 8) = local_6e8._8_8_;
    local_6e8._8_8_ = 0;
    local_6e8._0_8_ = pcVar1;
    local_6e8[0x10] = '\0';
    *(code **)((long)local_5d8._M_unused._0_8_ + 0x20) =
         (code *)((long)local_5d8._M_unused._0_8_ + 0x30);
    if ((undefined1 *)local_6c8._M_allocated_capacity == &local_6b8) {
      *(ulong *)((long)local_5d8._M_unused._0_8_ + 0x30) = CONCAT71(uStack_6b7,local_6b8);
      *(ulong *)((long)local_5d8._M_unused._0_8_ + 0x38) = uStack_6b0;
    }
    else {
      *(size_type *)((long)local_5d8._M_unused._0_8_ + 0x20) = local_6c8._M_allocated_capacity;
      *(ulong *)((long)local_5d8._M_unused._0_8_ + 0x30) = CONCAT71(uStack_6b7,local_6b8);
    }
    *(undefined8 *)((long)local_5d8._M_unused._0_8_ + 0x28) = local_6c8._8_8_;
    local_6c8._8_8_ = 0;
    local_6b8 = 0;
    pcStack_5c0 = std::
                  _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1840:19)>
                  ::_M_invoke;
    local_5c8 = std::
                _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1840:19)>
                ::_M_manager;
    local_358._M_unused._M_object = (void *)0x0;
    local_358._8_8_ = 0;
    local_348 = (code *)0x0;
    uStack_340 = 0;
    local_f8._M_unused._M_object = (void *)0x0;
    local_f8._8_8_ = 0;
    local_e8 = (code *)0x0;
    uStack_e0 = 0;
    local_6c8._M_allocated_capacity = (size_type)&local_6b8;
    BuildSystemRule::BuildSystemRule
              (pBVar16,in_RDX,(CommandSignature *)local_688,
               (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_5d8,
               (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                *)&local_358,
               (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               &local_f8);
    (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar16;
    if (local_e8 != (code *)0x0) {
      (*local_e8)(&local_f8,&local_f8,__destroy_functor);
    }
    if (local_348 != (code *)0x0) {
      (*local_348)(&local_358,&local_358,__destroy_functor);
    }
    if (local_5c8 != (code *)0x0) {
      p_Var22 = &local_5d8;
      pcVar18 = local_5c8;
LAB_0019ed07:
      (*pcVar18)(p_Var22,p_Var22,__destroy_functor);
    }
    goto LAB_0019ed11;
  case DirectoryTreeSignature:
    SVar23 = llbuild::buildsystem::BuildKey::getDirectoryTreeSignaturePath(&local_660);
    pcVar13 = SVar23.Data;
    if (pcVar13 == (char *)0x0) {
      local_6a8.value = (uint64_t)local_698;
      local_6a0 = 0;
      local_698._0_4_ = local_698._0_4_ & 0xffffff00;
    }
    else {
      local_6a8.value = (uint64_t)local_698;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6a8,pcVar13,pcVar13 + SVar23.Length);
    }
    SVar23 = llbuild::buildsystem::BuildKey::getContentExclusionPatterns(&local_660);
    pcVar13 = SVar23.Data;
    if (pcVar13 == (char *)0x0) {
      local_688._8_8_ = &local_670;
      local_678 = 0;
      local_670 = 0;
    }
    else {
      local_688._8_8_ = &local_670;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_688 + 8),pcVar13,pcVar13 + SVar23.Length);
    }
    pBVar16 = (BuildSystemRule *)operator_new(0x90);
    local_688._0_8_ = 0;
    pcVar1 = local_6e8 + 0x10;
    local_6e8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_6e8,local_6a8.value,(undefined1 *)(local_6a0 + local_6a8.value));
    local_6c8._M_allocated_capacity = (size_type)&local_6b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6c8,local_688._8_8_,(undefined1 *)(local_678 + local_688._8_8_));
    local_5e8 = (code *)0x0;
    pcStack_5e0 = (code *)0x0;
    local_5f8._M_unused._M_object = (void *)0x0;
    local_5f8._8_8_ = 0;
    local_5f8._M_unused._M_object = operator_new(0x40);
    *(code **)local_5f8._M_unused._0_8_ = (code *)((long)local_5f8._M_unused._0_8_ + 0x10);
    if ((pointer)local_6e8._0_8_ == pcVar1) {
      *(ulong *)((long)local_5f8._M_unused._0_8_ + 0x10) =
           CONCAT71(local_6e8._17_7_,local_6e8[0x10]);
      *(undefined8 *)((long)local_5f8._M_unused._0_8_ + 0x18) = local_6e8._24_8_;
    }
    else {
      *(undefined8 *)local_5f8._M_unused._0_8_ = local_6e8._0_8_;
      *(ulong *)((long)local_5f8._M_unused._0_8_ + 0x10) =
           CONCAT71(local_6e8._17_7_,local_6e8[0x10]);
    }
    *(undefined8 *)((long)local_5f8._M_unused._0_8_ + 8) = local_6e8._8_8_;
    local_6e8._8_8_ = 0;
    local_6e8._0_8_ = pcVar1;
    local_6e8[0x10] = '\0';
    *(code **)((long)local_5f8._M_unused._0_8_ + 0x20) =
         (code *)((long)local_5f8._M_unused._0_8_ + 0x30);
    if ((undefined1 *)local_6c8._M_allocated_capacity == &local_6b8) {
      *(ulong *)((long)local_5f8._M_unused._0_8_ + 0x30) = CONCAT71(uStack_6b7,local_6b8);
      *(ulong *)((long)local_5f8._M_unused._0_8_ + 0x38) = uStack_6b0;
    }
    else {
      *(size_type *)((long)local_5f8._M_unused._0_8_ + 0x20) = local_6c8._M_allocated_capacity;
      *(ulong *)((long)local_5f8._M_unused._0_8_ + 0x30) = CONCAT71(uStack_6b7,local_6b8);
    }
    *(undefined8 *)((long)local_5f8._M_unused._0_8_ + 0x28) = local_6c8._8_8_;
    local_6c8._8_8_ = 0;
    local_6b8 = 0;
    pcStack_5e0 = std::
                  _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1854:19)>
                  ::_M_invoke;
    local_5e8 = std::
                _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1854:19)>
                ::_M_manager;
    local_378._M_unused._M_object = (void *)0x0;
    local_378._8_8_ = 0;
    local_368 = (code *)0x0;
    uStack_360 = 0;
    local_118._M_unused._M_object = (void *)0x0;
    local_118._8_8_ = 0;
    local_108 = (code *)0x0;
    uStack_100 = 0;
    local_6c8._M_allocated_capacity = (size_type)&local_6b8;
    BuildSystemRule::BuildSystemRule
              (pBVar16,in_RDX,(CommandSignature *)local_688,
               (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_5f8,
               (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                *)&local_378,
               (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               &local_118);
    (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar16;
    if (local_108 != (code *)0x0) {
      (*local_108)(&local_118,&local_118,__destroy_functor);
    }
    if (local_368 != (code *)0x0) {
      (*local_368)(&local_378,&local_378,__destroy_functor);
    }
    if (local_5e8 != (code *)0x0) {
      p_Var22 = &local_5f8;
      pcVar18 = local_5e8;
      goto LAB_0019ed07;
    }
    goto LAB_0019ed11;
  case DirectoryTreeStructureSignature:
    SVar23 = llbuild::buildsystem::BuildKey::getFilteredDirectoryPath(&local_660);
    pcVar13 = SVar23.Data;
    if (pcVar13 == (char *)0x0) {
      local_6a8.value = (uint64_t)local_698;
      local_6a0 = 0;
      local_698._0_4_ = local_698._0_4_ & 0xffffff00;
    }
    else {
      local_6a8.value = (uint64_t)local_698;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6a8,pcVar13,pcVar13 + SVar23.Length);
    }
    SVar23 = llbuild::buildsystem::BuildKey::getContentExclusionPatterns(&local_660);
    pcVar13 = SVar23.Data;
    if (pcVar13 == (char *)0x0) {
      local_688._8_8_ = &local_670;
      local_678 = 0;
      local_670 = 0;
    }
    else {
      local_688._8_8_ = &local_670;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_688 + 8),pcVar13,pcVar13 + SVar23.Length);
    }
    pBVar16 = (BuildSystemRule *)operator_new(0x90);
    local_688._0_8_ = 0;
    pcVar1 = local_6e8 + 0x10;
    local_6e8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_6e8,local_6a8.value,(undefined1 *)(local_6a0 + local_6a8.value));
    local_6c8._M_allocated_capacity = (size_type)&local_6b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6c8,local_688._8_8_,(undefined1 *)(local_678 + local_688._8_8_));
    local_608 = (code *)0x0;
    pcStack_600 = (code *)0x0;
    local_618._M_unused._M_object = (void *)0x0;
    local_618._8_8_ = 0;
    local_618._M_unused._M_object = operator_new(0x40);
    *(code **)local_618._M_unused._0_8_ = (code *)((long)local_618._M_unused._0_8_ + 0x10);
    if ((pointer)local_6e8._0_8_ == pcVar1) {
      *(ulong *)((long)local_618._M_unused._0_8_ + 0x10) =
           CONCAT71(local_6e8._17_7_,local_6e8[0x10]);
      *(undefined8 *)((long)local_618._M_unused._0_8_ + 0x18) = local_6e8._24_8_;
    }
    else {
      *(undefined8 *)local_618._M_unused._0_8_ = local_6e8._0_8_;
      *(ulong *)((long)local_618._M_unused._0_8_ + 0x10) =
           CONCAT71(local_6e8._17_7_,local_6e8[0x10]);
    }
    *(undefined8 *)((long)local_618._M_unused._0_8_ + 8) = local_6e8._8_8_;
    local_6e8._8_8_ = 0;
    local_6e8._0_8_ = pcVar1;
    local_6e8[0x10] = '\0';
    *(code **)((long)local_618._M_unused._0_8_ + 0x20) =
         (code *)((long)local_618._M_unused._0_8_ + 0x30);
    if ((undefined1 *)local_6c8._M_allocated_capacity == &local_6b8) {
      *(ulong *)((long)local_618._M_unused._0_8_ + 0x30) = CONCAT71(uStack_6b7,local_6b8);
      *(ulong *)((long)local_618._M_unused._0_8_ + 0x38) = uStack_6b0;
    }
    else {
      *(size_type *)((long)local_618._M_unused._0_8_ + 0x20) = local_6c8._M_allocated_capacity;
      *(ulong *)((long)local_618._M_unused._0_8_ + 0x30) = CONCAT71(uStack_6b7,local_6b8);
    }
    *(undefined8 *)((long)local_618._M_unused._0_8_ + 0x28) = local_6c8._8_8_;
    local_6c8._8_8_ = 0;
    local_6b8 = 0;
    pcStack_600 = std::
                  _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1871:19)>
                  ::_M_invoke;
    local_608 = std::
                _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1871:19)>
                ::_M_manager;
    local_398._M_unused._M_object = (void *)0x0;
    local_398._8_8_ = 0;
    local_388 = (code *)0x0;
    uStack_380 = 0;
    local_138._M_unused._M_object = (void *)0x0;
    local_138._8_8_ = 0;
    local_128 = (code *)0x0;
    uStack_120 = 0;
    local_6c8._M_allocated_capacity = (size_type)&local_6b8;
    BuildSystemRule::BuildSystemRule
              (pBVar16,in_RDX,(CommandSignature *)local_688,
               (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_618,
               (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                *)&local_398,
               (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               &local_138);
    (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar16;
    if (local_128 != (code *)0x0) {
      (*local_128)(&local_138,&local_138,__destroy_functor);
    }
    if (local_388 != (code *)0x0) {
      (*local_388)(&local_398,&local_398,__destroy_functor);
    }
    if (local_608 != (code *)0x0) {
      p_Var22 = &local_618;
      pcVar18 = local_608;
      goto LAB_0019ed07;
    }
LAB_0019ed11:
    if ((undefined1 *)local_6c8._M_allocated_capacity != &local_6b8) {
      operator_delete((void *)local_6c8._M_allocated_capacity,CONCAT71(uStack_6b7,local_6b8) + 1);
    }
    if ((undefined1 *)local_6e8._0_8_ != local_6e8 + 0x10) {
      operator_delete((void *)local_6e8._0_8_,CONCAT71(local_6e8._17_7_,local_6e8[0x10]) + 1);
    }
    if ((undefined1 *)local_688._8_8_ != &local_670) {
      operator_delete((void *)local_688._8_8_,CONCAT71(uStack_66f,local_670) + 1);
    }
    if ((StatNode *)local_6a8.value != (StatNode *)local_698) {
      lVar20 = CONCAT44(local_698._4_4_,local_698._0_4_);
      CVar21.value = local_6a8.value;
LAB_0019ed70:
      operator_delete((void *)CVar21.value,lVar20 + 1);
    }
    goto LAB_0019f2d7;
  case Node:
    SVar23 = llbuild::buildsystem::BuildKey::getNodeName(&local_660);
    this_00 = lookupNode((BuildSystemEngineDelegate *)keyData,SVar23);
    NVar2 = this_00->type;
    if ((this_00->super_Node).producers.
        super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this_00->super_Node).producers.
        super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pBVar16 = (BuildSystemRule *)operator_new(0x90);
      if (NVar2 == Directory) {
        local_6e8._0_8_ = llbuild::buildsystem::BuildNode::getSignature(this_00);
        local_3f8._8_8_ = 0;
        pcStack_3e0 = std::
                      _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1915:23)>
                      ::_M_invoke;
        local_3e8 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1915:23)>
                    ::_M_manager;
        local_418._M_unused._M_object = (void *)0x0;
        local_418._8_8_ = 0;
        local_408 = (code *)0x0;
        uStack_400 = 0;
        local_178._M_unused._M_object = (void *)0x0;
        local_178._8_8_ = 0;
        local_168 = (code *)0x0;
        uStack_160 = 0;
        local_3f8._M_unused._0_8_ = (undefined8)this_00;
        BuildSystemRule::BuildSystemRule
                  (pBVar16,in_RDX,(CommandSignature *)local_6e8,
                   (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_3f8,
                   (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                    *)&local_418,
                   (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *
                   )&local_178);
        (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar16;
        if (local_168 != (code *)0x0) {
          (*local_168)(&local_178,&local_178,__destroy_functor);
        }
        if (local_408 != (code *)0x0) {
          (*local_408)(&local_418,&local_418,__destroy_functor);
        }
        if (local_3e8 == (code *)0x0) goto LAB_0019f2d7;
        p_Var22 = &local_3f8;
        pcVar18 = local_3e8;
      }
      else if (NVar2 == DirectoryStructure) {
        local_6e8._0_8_ = llbuild::buildsystem::BuildNode::getSignature(this_00);
        local_438._8_8_ = 0;
        pcStack_420 = std::
                      _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1928:23)>
                      ::_M_invoke;
        local_428 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1928:23)>
                    ::_M_manager;
        local_458._M_unused._M_object = (void *)0x0;
        local_458._8_8_ = 0;
        local_448 = (code *)0x0;
        uStack_440 = 0;
        local_198._M_unused._M_object = (void *)0x0;
        local_198._8_8_ = 0;
        local_188 = (code *)0x0;
        uStack_180 = 0;
        local_438._M_unused._0_8_ = (undefined8)this_00;
        BuildSystemRule::BuildSystemRule
                  (pBVar16,in_RDX,(CommandSignature *)local_6e8,
                   (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_438,
                   (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                    *)&local_458,
                   (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *
                   )&local_198);
        (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar16;
        if (local_188 != (code *)0x0) {
          (*local_188)(&local_198,&local_198,__destroy_functor);
        }
        if (local_448 != (code *)0x0) {
          (*local_448)(&local_458,&local_458,__destroy_functor);
        }
        if (local_428 == (code *)0x0) goto LAB_0019f2d7;
        p_Var22 = &local_438;
        pcVar18 = local_428;
      }
      else if (NVar2 == Virtual) {
        local_6e8._0_8_ = llbuild::buildsystem::BuildNode::getSignature(this_00);
        local_3b8._M_unused._M_object = (void *)0x0;
        local_3b8._8_8_ = 0;
        local_3a0 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1899:23)>
                    ::_M_invoke;
        local_3a8 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1899:23)>
                    ::_M_manager;
        local_3d8._8_8_ = 0;
        pcStack_3c0 = std::
                      _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1902:24)>
                      ::_M_invoke;
        local_3c8 = std::
                    _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1902:24)>
                    ::_M_manager;
        local_158._M_unused._M_object = (void *)0x0;
        local_158._8_8_ = 0;
        local_148 = (code *)0x0;
        uStack_140 = 0;
        local_3d8._M_unused._0_8_ = this_00;
        BuildSystemRule::BuildSystemRule
                  (pBVar16,in_RDX,(CommandSignature *)local_6e8,
                   (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_3b8,
                   (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                    *)&local_3d8,
                   (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *
                   )&local_158);
        (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar16;
        if (local_148 != (code *)0x0) {
          (*local_148)(&local_158,&local_158,__destroy_functor);
        }
        if (local_3c8 != (code *)0x0) {
          (*local_3c8)(&local_3d8,&local_3d8,__destroy_functor);
        }
        if (local_3a8 == (code *)0x0) goto LAB_0019f2d7;
        p_Var22 = &local_3b8;
        pcVar18 = local_3a8;
      }
      else {
        local_6e8._0_8_ = llbuild::buildsystem::BuildNode::getSignature(this_00);
        local_478._8_8_ = 0;
        pcStack_460 = std::
                      _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1941:21)>
                      ::_M_invoke;
        local_468 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1941:21)>
                    ::_M_manager;
        local_498._8_8_ = 0;
        pcStack_480 = std::
                      _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1944:22)>
                      ::_M_invoke;
        local_488 = std::
                    _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1944:22)>
                    ::_M_manager;
        local_1b8._M_unused._M_object = (void *)0x0;
        local_1b8._8_8_ = 0;
        local_1a8 = (code *)0x0;
        uStack_1a0 = 0;
        local_498._M_unused._0_8_ = (undefined8)this_00;
        local_478._M_unused._0_8_ = this_00;
        BuildSystemRule::BuildSystemRule
                  (pBVar16,in_RDX,(CommandSignature *)local_6e8,
                   (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_478,
                   (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                    *)&local_498,
                   (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *
                   )&local_1b8);
        (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar16;
        if (local_1a8 != (code *)0x0) {
          (*local_1a8)(&local_1b8,&local_1b8,__destroy_functor);
        }
        if (local_488 != (code *)0x0) {
          (*local_488)(&local_498,&local_498,__destroy_functor);
        }
        if (local_468 == (code *)0x0) goto LAB_0019f2d7;
        p_Var22 = &local_478;
        pcVar18 = local_468;
      }
    }
    else {
      pBVar16 = (BuildSystemRule *)operator_new(0x90);
      if (NVar2 == Directory) {
        local_6e8._0_8_ = llbuild::buildsystem::BuildNode::getSignature(this_00);
        local_4b8._8_8_ = 0;
        pcStack_4a0 = std::
                      _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1958:21)>
                      ::_M_invoke;
        local_4a8 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1958:21)>
                    ::_M_manager;
        local_4d8._8_8_ = 0;
        pcStack_4c0 = std::
                      _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1961:22)>
                      ::_M_invoke;
        local_4c8 = std::
                    _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1961:22)>
                    ::_M_manager;
        local_1d8._M_unused._M_object = (void *)0x0;
        local_1d8._8_8_ = 0;
        local_1c8 = (code *)0x0;
        uStack_1c0 = 0;
        local_4d8._M_unused._0_8_ = this_00;
        local_4b8._M_unused._0_8_ = this_00;
        BuildSystemRule::BuildSystemRule
                  (pBVar16,in_RDX,(CommandSignature *)local_6e8,
                   (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_4b8,
                   (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                    *)&local_4d8,
                   (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *
                   )&local_1d8);
        (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar16;
        if (local_1c8 != (code *)0x0) {
          (*local_1c8)(&local_1d8,&local_1d8,__destroy_functor);
        }
        if (local_4c8 != (code *)0x0) {
          (*local_4c8)(&local_4d8,&local_4d8,__destroy_functor);
        }
        if (local_4a8 == (code *)0x0) goto LAB_0019f2d7;
        p_Var22 = &local_4b8;
        pcVar18 = local_4a8;
      }
      else {
        local_6e8._0_8_ = llbuild::buildsystem::BuildNode::getSignature(this_00);
        local_4f8._8_8_ = 0;
        pcStack_4e0 = std::
                      _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1973:19)>
                      ::_M_invoke;
        local_4e8 = std::
                    _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1973:19)>
                    ::_M_manager;
        local_518._8_8_ = 0;
        pcStack_500 = std::
                      _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1976:20)>
                      ::_M_invoke;
        local_508 = std::
                    _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:1976:20)>
                    ::_M_manager;
        local_1f8._M_unused._M_object = (void *)0x0;
        local_1f8._8_8_ = 0;
        local_1e8 = (code *)0x0;
        uStack_1e0 = 0;
        local_518._M_unused._0_8_ = this_00;
        local_4f8._M_unused._0_8_ = this_00;
        BuildSystemRule::BuildSystemRule
                  (pBVar16,in_RDX,(CommandSignature *)local_6e8,
                   (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_4f8,
                   (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                    *)&local_518,
                   (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *
                   )&local_1f8);
        (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar16;
        if (local_1e8 != (code *)0x0) {
          (*local_1e8)(&local_1f8,&local_1f8,__destroy_functor);
        }
        if (local_508 != (code *)0x0) {
          (*local_508)(&local_518,&local_518,__destroy_functor);
        }
        if (local_4e8 == (code *)0x0) goto LAB_0019f2d7;
        p_Var22 = &local_4f8;
        pcVar18 = local_4e8;
      }
    }
    break;
  case Stat:
    this_02 = &keyData[2].key._M_string_length;
    SVar23 = llbuild::buildsystem::BuildKey::getStatName(&local_660);
    pcVar13 = SVar23.Data;
    if (pcVar13 == (char *)0x0) {
      local_6e8._8_8_ = 0;
      local_6e8._0_8_ = local_6e8 + 0x10;
      local_6e8[0x10] = '\0';
    }
    else {
      local_6e8._0_8_ = local_6e8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6e8,pcVar13,pcVar13 + SVar23.Length);
    }
    iVar17 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)this_02,(key_type *)local_6e8);
    pcVar1 = local_6e8 + 0x10;
    if ((pointer)local_6e8._0_8_ != pcVar1) {
      operator_delete((void *)local_6e8._0_8_,CONCAT71(local_6e8._17_7_,local_6e8[0x10]) + 1);
    }
    if (iVar17.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      local_6e8._0_16_ = (undefined1  [16])llbuild::buildsystem::BuildKey::getStatName(&local_660);
      llvm::make_unique<llbuild::buildsystem::StatNode,llvm::StringRef>
                ((llvm *)&local_6a8,(StringRef *)local_6e8);
      CVar21.value = local_6a8.value;
      SVar23 = llbuild::buildsystem::BuildKey::getStatName(&local_660);
      pcVar13 = SVar23.Data;
      if (pcVar13 == (char *)0x0) {
        local_6e8._8_8_ = 0;
        local_6e8._0_8_ = pcVar1;
        local_6e8[0x10] = '\0';
      }
      else {
        local_6e8._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_6e8,pcVar13,pcVar13 + SVar23.Length);
      }
      this_01 = (default_delete<llbuild::buildsystem::StatNode> *)
                std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)this_02,(key_type *)local_6e8);
      CVar10.value = local_6a8.value;
      local_6a8.value = 0;
      __ptr_00 = *(StatNode **)this_01;
      *(uint64_t *)this_01 = CVar10.value;
      if (__ptr_00 != (StatNode *)0x0) {
        std::default_delete<llbuild::buildsystem::StatNode>::operator()(this_01,__ptr_00);
      }
      if ((pointer)local_6e8._0_8_ != pcVar1) {
        operator_delete((void *)local_6e8._0_8_,CONCAT71(local_6e8._17_7_,local_6e8[0x10]) + 1);
      }
      if ((StatNode *)local_6a8.value != (StatNode *)0x0) {
        std::default_delete<llbuild::buildsystem::StatNode>::operator()
                  ((default_delete<llbuild::buildsystem::StatNode> *)&local_6a8,
                   (StatNode *)local_6a8.value);
      }
    }
    else {
      CVar21.value = *(undefined8 *)
                      ((long)iVar17.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>,_true>
                             ._M_cur + 0x28);
    }
    pBVar16 = (BuildSystemRule *)operator_new(0x90);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_6e8._8_8_;
    local_6e8._0_16_ = auVar6 << 0x40;
    local_538._8_8_ = 0;
    pcStack_520 = std::
                  _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:2000:19)>
                  ::_M_invoke;
    local_528 = std::
                _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:2000:19)>
                ::_M_manager;
    local_558._8_8_ = 0;
    pcStack_540 = std::
                  _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:2003:20)>
                  ::_M_invoke;
    local_548 = std::
                _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:2003:20)>
                ::_M_manager;
    local_218._M_unused._M_object = (void *)0x0;
    local_218._8_8_ = 0;
    local_208 = (code *)0x0;
    uStack_200 = 0;
    local_558._M_unused._0_8_ = (undefined8)CVar21.value;
    local_538._M_unused._0_8_ = CVar21.value;
    BuildSystemRule::BuildSystemRule
              (pBVar16,in_RDX,(CommandSignature *)local_6e8,
               (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_538,
               (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                *)&local_558,
               (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               &local_218);
    (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar16;
    if (local_208 != (code *)0x0) {
      (*local_208)(&local_218,&local_218,__destroy_functor);
    }
    if (local_548 != (code *)0x0) {
      (*local_548)(&local_558,&local_558,__destroy_functor);
    }
    if (local_528 == (code *)0x0) goto LAB_0019f2d7;
    p_Var22 = &local_538;
    pcVar18 = local_528;
    break;
  case Target:
    lVar20 = *(long *)((keyData->key)._M_string_length + 0x68);
    if (lVar20 == 0) goto LAB_0019f57e;
    SVar23 = llbuild::buildsystem::BuildKey::getTargetName(&local_660);
    iVar12 = llvm::StringMapImpl::FindKey((StringMapImpl *)(lVar20 + 0x20),SVar23);
    uVar14 = (long)iVar12;
    if (iVar12 == -1) {
      uVar14 = (ulong)*(uint *)(lVar20 + 0x28);
    }
    lVar4 = *(long *)((keyData->key)._M_string_length + 0x68);
    if (lVar4 == 0) goto LAB_0019f57e;
    plVar15 = (long *)(uVar14 * 8 + *(long *)(lVar20 + 0x20));
    if (plVar15 == (long *)((ulong)*(uint *)(lVar4 + 0x28) * 8 + *(long *)(lVar4 + 0x20))) {
      __assert_fail("0 && \"FIXME: invalid target\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                    ,0x7df,
                    "virtual std::unique_ptr<Rule> (anonymous namespace)::BuildSystemEngineDelegate::lookupRule(const KeyType &)"
                   );
    }
    pvVar5 = *(void **)(*plVar15 + 8);
    pBVar16 = (BuildSystemRule *)operator_new(0x90);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_6e8._8_8_;
    local_6e8._0_16_ = auVar7 << 0x40;
    local_578._8_8_ = 0;
    pcStack_560 = std::
                  _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:2024:19)>
                  ::_M_invoke;
    local_568 = std::
                _Function_handler<llbuild::core::Task_*(llbuild::core::BuildEngine_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:2024:19)>
                ::_M_manager;
    local_598._8_8_ = 0;
    pcStack_580 = std::
                  _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:2027:20)>
                  ::_M_invoke;
    local_588 = std::
                _Function_handler<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:2027:20)>
                ::_M_manager;
    local_238._M_unused._M_object = (void *)0x0;
    local_238._8_8_ = 0;
    local_228 = (code *)0x0;
    uStack_220 = 0;
    local_598._M_unused._M_object = pvVar5;
    local_578._M_unused._M_object = pvVar5;
    BuildSystemRule::BuildSystemRule
              (pBVar16,in_RDX,(CommandSignature *)local_6e8,
               (function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *)&local_578,
               (function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                *)&local_598,
               (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               &local_238);
    (this->super_BuildEngineDelegate)._vptr_BuildEngineDelegate = (_func_int **)pBVar16;
    if (local_228 != (code *)0x0) {
      (*local_228)(&local_238,&local_238,__destroy_functor);
    }
    if (local_588 != (code *)0x0) {
      (*local_588)(&local_598,&local_598,__destroy_functor);
    }
    if (local_568 == (code *)0x0) goto LAB_0019f2d7;
    p_Var22 = &local_578;
    pcVar18 = local_568;
    break;
  default:
    __assert_fail("0 && \"invalid key type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                  ,0x7f4,
                  "virtual std::unique_ptr<Rule> (anonymous namespace)::BuildSystemEngineDelegate::lookupRule(const KeyType &)"
                 );
  }
  (*pcVar18)(p_Var22,p_Var22,__destroy_functor);
LAB_0019f2d7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660.key.key._M_dataplus._M_p != &local_660.key.key.field_2) {
    operator_delete(local_660.key.key._M_dataplus._M_p,
                    local_660.key.key.field_2._M_allocated_capacity + 1);
  }
  return (__uniq_ptr_data<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>,_true,_true>
         )(tuple<llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>)this;
}

Assistant:

std::unique_ptr<Rule> BuildSystemEngineDelegate::lookupRule(const KeyType& keyData) {
  // Decode the key.
  auto key = BuildKey::fromData(keyData);

  switch (key.getKind()) {
  case BuildKey::Kind::Unknown:
    break;
    
  case BuildKey::Kind::Command: {
    // Find the comand.
    auto it = getBuildDescription().getCommands().find(key.getCommandName());
    if (it == getBuildDescription().getCommands().end()) {
      // If there is no such command, produce an error task.
      return std::unique_ptr<Rule>(new BuildSystemRule(
        keyData,
        /*signature=*/{},
        /*Action=*/ [](BuildEngine& engine) -> Task* {
          return new MissingCommandTask();
        },
        /*IsValid=*/ [](BuildEngine&, const Rule&, const ValueType&) -> bool {
          // The cached result for a missing command is never valid.
          return false;
        }
      ));
    }

    // Create the rule for the command.
    Command* command = it->second.get();
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      command->getSignature(),
      /*Action=*/ [command](BuildEngine& engine) -> Task* {
        return new CommandTask(*command);
      },
      /*IsValid=*/ [command](BuildEngine& engine, const Rule& rule,
                             const ValueType& value) -> bool {
        return CommandTask::isResultValid(
            engine, *command, BuildValue::fromData(value));
      },
      /*UpdateStatus=*/ [command](BuildEngine& engine,
                                  core::Rule::StatusKind status) {
        return ::getBuildSystem(engine).getDelegate().commandStatusChanged(
            command, convertStatusKind(status));
      }
    ));
  }

  case BuildKey::Kind::CustomTask: {
    // Search for a tool which knows how to create the given custom task.
    //
    // FIXME: We should most likely have some kind of registration process so we
    // can do an efficient query here, but exactly how this should look isn't
    // clear yet.
    for (const auto& it: getBuildDescription().getTools()) {
      auto result = it.second->createCustomCommand(key);
      if (!result) continue;

      // Save the custom command.
      customTasks.emplace_back(std::move(result));
      Command *command = customTasks.back().get();
      
      return std::unique_ptr<Rule>(new BuildSystemRule(
        keyData,
        command->getSignature(),
        /*Action=*/ [command](BuildEngine& engine) -> Task* {
          return new CommandTask(*command);
        },
        /*IsValid=*/ [command](BuildEngine& engine, const Rule& rule,
                               const ValueType& value) -> bool {
          return CommandTask::isResultValid(
              engine, *command, BuildValue::fromData(value));
        },
        /*UpdateStatus=*/ [command](BuildEngine& engine,
                                    core::Rule::StatusKind status) {
          return ::getBuildSystem(engine).getDelegate().commandStatusChanged(
              command, convertStatusKind(status));
        }
      ));
    }
    
    // We were unable to create an appropriate custom command, produce an error
    // task.
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      /*signature=*/{},
      /*Action=*/ [](BuildEngine& engine) -> Task* {
        return new MissingCommandTask();
      },
      /*IsValid=*/ [](BuildEngine&, const Rule&, const ValueType&) -> bool {
        // The cached result for a missing command is never valid.
        return false;
      }
    ));
  }

  case BuildKey::Kind::DirectoryContents: {
    std::string path = key.getDirectoryPath();
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      /*signature=*/{},
      /*Action=*/ [path](BuildEngine& engine) -> Task* {
        return new DirectoryContentsTask(path);
      },
      /*IsValid=*/ [path](BuildEngine& engine, const Rule& rule,
          const ValueType& value) mutable -> bool {
        return DirectoryContentsTask::isResultValid(
            engine, path, BuildValue::fromData(value));
      }
    ));
  }

  case BuildKey::Kind::FilteredDirectoryContents: {
    std::string path = key.getFilteredDirectoryPath();
    std::string patterns = key.getContentExclusionPatterns();
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      /*signature=*/{},
      /*Action=*/ [path, patterns](BuildEngine& engine) -> Task* {
        BinaryDecoder decoder(patterns);
        return new FilteredDirectoryContentsTask(path, StringList(decoder));
      },
      /*IsValid=*/ nullptr
    ));
  }

  case BuildKey::Kind::DirectoryTreeSignature: {
    std::string path = key.getDirectoryTreeSignaturePath();
    std::string filters = key.getContentExclusionPatterns();
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      /*signature=*/{},
      /*Action=*/ [path, filters](
          BuildEngine& engine) mutable -> Task* {
        BinaryDecoder decoder(filters);
        return new DirectoryTreeSignatureTask(path, StringList(decoder));
      },
        // Directory signatures don't require any validation outside of their
        // concrete dependencies.
      /*IsValid=*/ nullptr
    ));
  }

  case BuildKey::Kind::DirectoryTreeStructureSignature: {
    std::string path = key.getFilteredDirectoryPath();
    std::string filters = key.getContentExclusionPatterns();
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      /*signature=*/{},
      /*Action=*/ [path, filters](
          BuildEngine& engine) mutable -> Task* {
        BinaryDecoder decoder(filters);
        return new DirectoryTreeStructureSignatureTask(path, StringList(decoder));
      },
        // Directory signatures don't require any validation outside of their
        // concrete dependencies.
      /*IsValid=*/ nullptr
    ));
  }
    
  case BuildKey::Kind::Node: {
    // Find the node.
    BuildNode* node = lookupNode(key.getNodeName());

    // Create the rule used to construct this node.
    //
    // We could bypass this level and directly return the rule to run the
    // command, which would reduce the number of tasks in the system. For now we
    // do the uniform thing, but do differentiate between input and command
    // nodes.

    // Create an input node if there are no producers.
    if (node->getProducers().empty()) {
      if (node->isVirtual()) {
        return std::unique_ptr<Rule>(new BuildSystemRule(
          keyData,
          node->getSignature(),
          /*Action=*/ [](BuildEngine& engine) -> Task* {
            return new VirtualInputNodeTask();
          },
          /*IsValid=*/ [node](BuildEngine& engine, const Rule& rule,
                                const ValueType& value) -> bool {
            return VirtualInputNodeTask::isResultValid(
                engine, *node, BuildValue::fromData(value));
          }
        ));
      }

      // DirectoryInputNodeTask
      if (node->isDirectory()) {
        return std::unique_ptr<Rule>(new BuildSystemRule(
          keyData,
          node->getSignature(),
          /*Action=*/ [node](BuildEngine& engine) -> Task* {
            return new DirectoryInputNodeTask(*node);
          },
            // Directory nodes don't require any validation outside of their
            // concrete dependencies.
          /*IsValid=*/ nullptr
        ));
      }

      if (node->isDirectoryStructure()) {
        return std::unique_ptr<Rule>(new BuildSystemRule(
          keyData,
          node->getSignature(),
          /*Action=*/ [node](BuildEngine& engine) -> Task* {
            return new DirectoryStructureInputNodeTask(*node);
          },
            // Directory nodes don't require any validation outside of their
            // concrete dependencies.
          /*IsValid=*/ nullptr
        ));
      }

      // FileInputNodeTask
      return std::unique_ptr<Rule>(new BuildSystemRule(
        keyData,
        node->getSignature(),
        /*Action=*/ [node](BuildEngine& engine) -> Task* {
          return new FileInputNodeTask(*node);
        },
        /*IsValid=*/ [node](BuildEngine& engine, const Rule& rule,
                            const ValueType& value) -> bool {
          return FileInputNodeTask::isResultValid(
              engine, *node, BuildValue::fromData(value));
        }
      ));
    }

    // Otherwise, create a task for a produced node.
    // ProducedDirectoryNodeTask
    if (node->isDirectory()) {
      return std::unique_ptr<Rule>(new BuildSystemRule(
        keyData,
        node->getSignature(),
        /*Action=*/ [node](BuildEngine& engine) -> Task* {
          return new ProducedDirectoryNodeTask(*node);
        },
        /*IsValid=*/ [node](BuildEngine& engine, const Rule& rule,
                            const ValueType& value) -> bool {
          return ProducedDirectoryNodeTask::isResultValid(
              engine, *node, BuildValue::fromData(value));
        }
      ));
    }

    // ProducedNodeTask
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      node->getSignature(),
      /*Action=*/ [node](BuildEngine& engine) -> Task* {
        return new ProducedNodeTask(*node);
      },
      /*IsValid=*/ [node](BuildEngine& engine, const Rule& rule,
                          const ValueType& value) -> bool {
        return ProducedNodeTask::isResultValid(
            engine, *node, BuildValue::fromData(value));
      }
    ));
  }

  case BuildKey::Kind::Stat: {
    StatNode* statnode;
    auto it = dynamicStatNodes.find(key.getStatName());
    if (it != dynamicStatNodes.end()) {
      statnode = it->second.get();
    } else {
      // Create nodes on the fly for any unknown ones.
      auto statOwner = llvm::make_unique<StatNode>(key.getStatName());
      statnode = statOwner.get();
      dynamicStatNodes[key.getStatName()] = std::move(statOwner);
    }

    // Create the rule to construct this target.
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      /*signature=*/{},
      /*Action=*/ [statnode](BuildEngine& engine) -> Task* {
        return new StatTask(*statnode);
      },
      /*IsValid=*/ [statnode](BuildEngine& engine, const Rule& rule,
                            const ValueType& value) -> bool {
        return StatTask::isResultValid(
            engine, *statnode, BuildValue::fromData(value));
      }
    ));
  }
  case BuildKey::Kind::Target: {
    // Find the target.
    auto it = getBuildDescription().getTargets().find(key.getTargetName());
    if (it == getBuildDescription().getTargets().end()) {
      // FIXME: Invalid target name, produce an error.
      assert(0 && "FIXME: invalid target");
      abort();
    }

    // Create the rule to construct this target.
    Target* target = it->second.get();
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      /*signature=*/{},
      /*Action=*/ [target](BuildEngine& engine) -> Task* {
        return new TargetTask(*target);
      },
      /*IsValid=*/ [target](BuildEngine& engine, const Rule& rule,
                            const ValueType& value) -> bool {
        return TargetTask::isResultValid(
            engine, *target, BuildValue::fromData(value));
      }
    ));
  }
  }

  assert(0 && "invalid key type");
  abort();
}